

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_session_copy(mbedtls_ssl_session *dst,mbedtls_ssl_session *src)

{
  uchar uVar1;
  undefined2 uVar2;
  mbedtls_ssl_protocol_version mVar3;
  int iVar4;
  mbedtls_x509_crt *crt;
  long lVar5;
  mbedtls_ssl_session *pmVar6;
  mbedtls_ssl_session *pmVar7;
  int iVar8;
  byte bVar9;
  
  bVar9 = 0;
  mbedtls_ssl_session_free(dst);
  pmVar6 = src;
  pmVar7 = dst;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = pmVar6->exported;
    uVar2 = *(undefined2 *)&pmVar6->field_0x2;
    mVar3 = pmVar6->tls_version;
    pmVar7->mfl_code = pmVar6->mfl_code;
    pmVar7->exported = uVar1;
    *(undefined2 *)&pmVar7->field_0x2 = uVar2;
    pmVar7->tls_version = mVar3;
    pmVar6 = (mbedtls_ssl_session *)((long)pmVar6 + (ulong)bVar9 * -0x10 + 8);
    pmVar7 = (mbedtls_ssl_session *)((long)pmVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  iVar8 = 0;
  if (src->peer_cert != (mbedtls_x509_crt *)0x0) {
    crt = (mbedtls_x509_crt *)calloc(1,0x2f0);
    dst->peer_cert = crt;
    if (crt == (mbedtls_x509_crt *)0x0) {
      iVar8 = -0x7f00;
    }
    else {
      mbedtls_x509_crt_init(crt);
      iVar4 = mbedtls_x509_crt_parse_der
                        (dst->peer_cert,(src->peer_cert->raw).p,(src->peer_cert->raw).len);
      iVar8 = 0;
      if (iVar4 != 0) {
        free(dst->peer_cert);
        dst->peer_cert = (mbedtls_x509_crt *)0x0;
        iVar8 = iVar4;
      }
    }
  }
  return iVar8;
}

Assistant:

int mbedtls_ssl_session_copy(mbedtls_ssl_session *dst,
                             const mbedtls_ssl_session *src)
{
    mbedtls_ssl_session_free(dst);
    memcpy(dst, src, sizeof(mbedtls_ssl_session));
#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    dst->ticket = NULL;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3) && \
    defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    dst->hostname = NULL;
#endif
#endif /* MBEDTLS_SSL_SESSION_TICKETS && MBEDTLS_SSL_CLI_C */

#if defined(MBEDTLS_X509_CRT_PARSE_C)

#if defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    if (src->peer_cert != NULL) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        dst->peer_cert = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));
        if (dst->peer_cert == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        mbedtls_x509_crt_init(dst->peer_cert);

        if ((ret = mbedtls_x509_crt_parse_der(dst->peer_cert, src->peer_cert->raw.p,
                                              src->peer_cert->raw.len)) != 0) {
            mbedtls_free(dst->peer_cert);
            dst->peer_cert = NULL;
            return ret;
        }
    }
#else /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    if (src->peer_cert_digest != NULL) {
        dst->peer_cert_digest =
            mbedtls_calloc(1, src->peer_cert_digest_len);
        if (dst->peer_cert_digest == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        memcpy(dst->peer_cert_digest, src->peer_cert_digest,
               src->peer_cert_digest_len);
        dst->peer_cert_digest_type = src->peer_cert_digest_type;
        dst->peer_cert_digest_len = src->peer_cert_digest_len;
    }
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

#endif /* MBEDTLS_X509_CRT_PARSE_C */

#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    if (src->ticket != NULL) {
        dst->ticket = mbedtls_calloc(1, src->ticket_len);
        if (dst->ticket == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        memcpy(dst->ticket, src->ticket, src->ticket_len);
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_3) && \
    defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if (src->endpoint == MBEDTLS_SSL_IS_CLIENT) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        ret = mbedtls_ssl_session_set_hostname(dst, src->hostname);
        if (ret != 0) {
            return ret;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 &&
          MBEDTLS_SSL_SERVER_NAME_INDICATION */
#endif /* MBEDTLS_SSL_SESSION_TICKETS && MBEDTLS_SSL_CLI_C */

    return 0;
}